

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::Image::Context::Context
          (Context *this,EglTestContext *eglTestCtx,EGLDisplay display,ContextType ctxType,int width
          ,int height)

{
  EGLDisplay pvVar1;
  PtrData<deqp::egl::Image::ManagedSurface,_de::DefaultDeleter<deqp::egl::Image::ManagedSurface>_>
  data;
  ApiType apiType;
  Library *pLVar2;
  EGLConfig pvVar3;
  Library *egl;
  EGLContext pvVar4;
  ManagedSurface *pMVar5;
  EGLSurface draw;
  EGLSurface read;
  MovePtr *this_00;
  ManagedSurface *in_stack_ffffffffffffff08;
  EglTestContext *this_01;
  undefined8 in_stack_ffffffffffffff10;
  Functions *dst;
  PtrData<deqp::egl::Image::ManagedSurface,_de::DefaultDeleter<deqp::egl::Image::ManagedSurface>_>
  local_58;
  PtrData<deqp::egl::Image::ManagedSurface,_de::DefaultDeleter<deqp::egl::Image::ManagedSurface>_>
  *local_48;
  deUint32 local_34;
  int local_30;
  int local_2c;
  int height_local;
  int width_local;
  EGLDisplay display_local;
  EglTestContext *eglTestCtx_local;
  Context *this_local;
  ContextType ctxType_local;
  
  this->m_eglTestCtx = eglTestCtx;
  this->m_display = display;
  local_30 = height;
  local_2c = width;
  _height_local = display;
  display_local = eglTestCtx;
  eglTestCtx_local = (EglTestContext *)this;
  this_local._4_4_ = ctxType.super_ApiType.m_bits;
  pLVar2 = EglTestContext::getLibrary(eglTestCtx);
  pvVar1 = _height_local;
  local_34 = (deUint32)glu::ContextType::getAPI((ContextType *)((long)&this_local + 4));
  pvVar3 = chooseConfig(pLVar2,pvVar1,(ApiType)local_34);
  this->m_config = pvVar3;
  pLVar2 = EglTestContext::getLibrary(this->m_eglTestCtx);
  pvVar1 = this->m_display;
  egl = EglTestContext::getLibrary((EglTestContext *)display_local);
  pvVar4 = eglu::createGLContext
                     (egl,this->m_display,this->m_config,(ContextType *)((long)&this_local + 4),
                      RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED);
  eglu::UniqueContext::UniqueContext(&this->m_context,pLVar2,pvVar1,pvVar4);
  this_00 = (MovePtr *)display_local;
  createSurface((MovePtr<deqp::egl::Image::ManagedSurface,_de::DefaultDeleter<deqp::egl::Image::ManagedSurface>_>
                 *)&local_58,(EglTestContext *)display_local,this->m_display,this->m_config,local_2c
                ,local_30);
  local_48 = de::details::MovePtr::operator_cast_to_PtrData(&local_58,this_00);
  data._8_8_ = in_stack_ffffffffffffff10;
  data.ptr = in_stack_ffffffffffffff08;
  de::details::
  UniquePtr<deqp::egl::Image::ManagedSurface,_de::DefaultDeleter<deqp::egl::Image::ManagedSurface>_>
  ::UniquePtr(&this->m_surface,data);
  de::details::
  MovePtr<deqp::egl::Image::ManagedSurface,_de::DefaultDeleter<deqp::egl::Image::ManagedSurface>_>::
  ~MovePtr((MovePtr<deqp::egl::Image::ManagedSurface,_de::DefaultDeleter<deqp::egl::Image::ManagedSurface>_>
            *)&local_58);
  pLVar2 = EglTestContext::getLibrary((EglTestContext *)display_local);
  pvVar1 = this->m_display;
  pMVar5 = de::details::
           UniqueBase<deqp::egl::Image::ManagedSurface,_de::DefaultDeleter<deqp::egl::Image::ManagedSurface>_>
           ::operator->(&(this->m_surface).
                         super_UniqueBase<deqp::egl::Image::ManagedSurface,_de::DefaultDeleter<deqp::egl::Image::ManagedSurface>_>
                       );
  draw = ManagedSurface::get(pMVar5);
  pMVar5 = de::details::
           UniqueBase<deqp::egl::Image::ManagedSurface,_de::DefaultDeleter<deqp::egl::Image::ManagedSurface>_>
           ::operator->(&(this->m_surface).
                         super_UniqueBase<deqp::egl::Image::ManagedSurface,_de::DefaultDeleter<deqp::egl::Image::ManagedSurface>_>
                       );
  read = ManagedSurface::get(pMVar5);
  pvVar4 = eglu::UniqueContext::operator*(&this->m_context);
  eglu::ScopedCurrentContext::ScopedCurrentContext(&this->m_current,pLVar2,pvVar1,draw,read,pvVar4);
  glw::Functions::Functions(&this->m_gl);
  this_01 = this->m_eglTestCtx;
  dst = &this->m_gl;
  apiType = glu::ContextType::getAPI((ContextType *)((long)&this_local + 4));
  EglTestContext::initGLFunctions(this_01,dst,apiType);
  return;
}

Assistant:

Context			(EglTestContext& eglTestCtx, EGLDisplay display, ContextType ctxType, int width, int height)
									: m_eglTestCtx	(eglTestCtx)
									, m_display		(display)
									, m_config		(chooseConfig(eglTestCtx.getLibrary(), display, ctxType.getAPI()))
									, m_context		(m_eglTestCtx.getLibrary(), m_display, eglu::createGLContext(eglTestCtx.getLibrary(), m_display, m_config, ctxType))
									, m_surface		(createSurface(eglTestCtx, m_display, m_config, width, height))
									, m_current		(eglTestCtx.getLibrary(), m_display, m_surface->get(), m_surface->get(), *m_context)
	{
		m_eglTestCtx.initGLFunctions(&m_gl, ctxType.getAPI());
	}